

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O1

void __thiscall
RandomWordTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>::
~RandomWordTestData(RandomWordTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                    *this)

{
  pointer puVar1;
  pointer pcVar2;
  
  puVar1 = (this->m_token_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_token_indexes).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  std::
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::~vector(&this->m_tokens);
  pcVar2 = (this->m_str).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2,(long)(this->m_str).
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pcVar2);
  }
  pcVar2 = (this->m_delim).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2,(long)(this->m_delim).
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pcVar2);
    return;
  }
  return;
}

Assistant:

RandomWordTestData(T in_delim = default_delim<T>, size_t in_fixed_word_count = 0, size_t in_fixed_word_length = 0)
		: m_fixed_word_count{ in_fixed_word_count },
		m_fixed_word_length{ in_fixed_word_length } {
		m_delim.insert(m_delim.end(), in_delim);
		populate();
	}